

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::insert_edge_(DaTrie<false,_false,_false> *this,Query *query)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint node_pos;
  reference pvVar4;
  Query *this_00;
  DaTrie<false,_false,_false> *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  Query *in_stack_00000288;
  DaTrie<false,_false,_false> *in_stack_00000290;
  uint32_t in_stack_ffffffffffffffcc;
  
  uVar3 = Query::node_pos((Query *)in_RSI);
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  uVar3 = Bc::base(pvVar4);
  bVar1 = Query::label((Query *)in_RSI);
  node_pos = uVar3 ^ bVar1;
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)node_pos);
  bVar2 = Bc::is_fixed(pvVar4);
  if (bVar2) {
    solve_(in_stack_00000290,in_stack_00000288);
    uVar3 = Query::node_pos((Query *)in_RSI);
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    uVar3 = Bc::base(pvVar4);
    bVar1 = Query::label((Query *)in_RSI);
    node_pos = uVar3 ^ bVar1;
  }
  fix_(in_RSI,node_pos,(vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_RDI);
  this_00 = (Query *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                               (in_RDI,(ulong)node_pos);
  uVar3 = Query::node_pos((Query *)in_RSI);
  Bc::set_check((Bc *)this_00,uVar3);
  Query::next(this_00,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }